

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O2

void redit(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  AREA_DATA_conflict *pAVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  char command [4608];
  char arg [4608];
  
  pRVar1 = ch->in_room;
  pAVar2 = pRVar1->area;
  smash_tilde(argument);
  strcpy(arg,argument);
  pcVar8 = one_argument(argument,command);
  bVar4 = is_switched(ch);
  if (bVar4) {
LAB_00398b98:
    send_to_char("REdit:  Insufficient security to modify room.\n\r",ch);
  }
  else {
    if (ch->pcdata->security <= pAVar2->security) {
      pcVar10 = pAVar2->builders;
      pcVar9 = strstr(pcVar10,ch->name);
      if ((pcVar9 == (char *)0x0) && (pcVar10 = strstr(pcVar10,"All"), pcVar10 == (char *)0x0))
      goto LAB_00398b98;
    }
    bVar4 = str_cmp(command,"done");
    if ((bVar4) && (bVar4 = str_cmp(command,"quit"), bVar4)) {
      bVar4 = is_switched(ch);
      if (bVar4) {
LAB_00398c29:
        interpret(ch,arg);
        return;
      }
      if (ch->pcdata->security <= pAVar2->security) {
        pcVar10 = pAVar2->builders;
        pcVar9 = strstr(pcVar10,ch->name);
        if ((pcVar9 == (char *)0x0) && (pcVar10 = strstr(pcVar10,"All"), pcVar10 == (char *)0x0))
        goto LAB_00398c29;
      }
      bVar4 = str_cmp(command,"");
      if (!bVar4) {
        redit_show(ch,"");
        return;
      }
      iVar6 = flag_value(room_flags,command);
      if (iVar6 == -99) {
        iVar6 = flag_value(sector_flags,command);
        if (iVar6 == -99) {
          bVar4 = str_prefix(command,"north");
          if (!bVar4) {
            builtin_strncpy(command,"north",6);
          }
          bVar4 = str_prefix(command,"south");
          if (!bVar4) {
            builtin_strncpy(command,"south",6);
          }
          bVar4 = str_prefix(command,"east");
          if (!bVar4) {
            command._4_2_ = command._4_2_ & 0xff00;
            builtin_strncpy(command,"east",4);
          }
          bVar4 = str_prefix(command,"west");
          if (!bVar4) {
            command._4_2_ = command._4_2_ & 0xff00;
            builtin_strncpy(command,"west",4);
          }
          bVar4 = str_prefix(command,"up");
          if (!bVar4) {
            command._2_2_ = SUB42(command._0_4_,2) & 0xff00;
            command[0] = 'u';
            command[1] = 'p';
          }
          bVar4 = str_prefix(command,"down");
          if (!bVar4) {
            command._4_2_ = command._4_2_ & 0xff00;
            builtin_strncpy(command,"down",4);
          }
          lVar3 = 0;
          while (lVar12 = lVar3, lVar12 + 0x10 != 0x200) {
            bVar4 = str_prefix(command,*(char **)((long)&redit_table[0].name + lVar12));
            lVar3 = lVar12 + 0x10;
            if (!bVar4) {
              cVar5 = (**(code **)((long)&redit_table[0].olc_fun + lVar12))(ch,pcVar8);
              if (cVar5 == '\0') {
                return;
              }
              *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 8;
              return;
            }
          }
          goto LAB_00398c29;
        }
        pRVar1->sector_type = (short)iVar6;
        *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 8;
        pcVar8 = "Sector type set.\n\r";
      }
      else {
        iVar7 = iVar6 / 0x20;
        uVar11 = pRVar1->room_flags[iVar7];
        dVar13 = ldexp(1.0,iVar6 % 0x20);
        dVar14 = ldexp(1.0,iVar6 % 0x20);
        if ((uVar11 & (long)dVar13) == 0) {
          uVar11 = (long)dVar14 | pRVar1->room_flags[iVar7];
        }
        else {
          uVar11 = ~(long)dVar14 & pRVar1->room_flags[iVar7];
        }
        pRVar1->room_flags[iVar7] = uVar11;
        *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 8;
        pcVar8 = "Room flag toggled.\n\r";
      }
      send_to_char(pcVar8,ch);
      return;
    }
  }
  edit_done(ch);
  return;
}

Assistant:

void redit(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	AREA_DATA *pArea;
	char arg[MAX_STRING_LENGTH];
	char command[MAX_INPUT_LENGTH];
	int cmd;
	int value;

	EDIT_ROOM(ch, pRoom);
	pArea = pRoom->area;

	smash_tilde(argument);
	strcpy(arg, argument);
	argument = one_argument(argument, command);

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Insufficient security to modify room.\n\r", ch);
		edit_done(ch);
		return;
	}

	if (!str_cmp(command, "done") || !str_cmp(command, "quit"))
	{
		edit_done(ch);
		return;
	}

	if (!IS_BUILDER(ch, pArea))
		return interpret(ch, arg);

	if (!str_cmp(command, ""))
	{
		redit_show(ch, "");
		return;
	}

	if ((value = flag_value(room_flags, command)) != NO_FLAG)
	{
		TOGGLE_BIT(pRoom->room_flags, value);

		SET_BIT(pArea->area_flags, AREA_CHANGED);
		send_to_char("Room flag toggled.\n\r", ch);
		return;
	}

	if ((value = flag_value(sector_flags, command)) != NO_FLAG)
	{
		pRoom->sector_type = value;

		SET_BIT(pArea->area_flags, AREA_CHANGED);
		send_to_char("Sector type set.\n\r", ch);
		return;
	}

	/* Check for moment */
	if (!str_prefix(command, "north"))
		sprintf(command, "north");

	if (!str_prefix(command, "south"))
		sprintf(command, "south");

	if (!str_prefix(command, "east"))
		sprintf(command, "east");

	if (!str_prefix(command, "west"))
		sprintf(command, "west");

	if (!str_prefix(command, "up"))
		sprintf(command, "up");

	if (!str_prefix(command, "down"))
		sprintf(command, "down");

	/* Search Table and Dispatch Command. */
	for (cmd = 0; redit_table[cmd].name != nullptr; cmd++)
	{
		if (!str_prefix(command, redit_table[cmd].name))
		{
			if ((*redit_table[cmd].olc_fun)(ch, argument))
				SET_BIT(pArea->area_flags, AREA_CHANGED);

			return;
		}
	}

	/* Default to Standard Interpreter. */
	interpret(ch, arg);
}